

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLExportTest_writeFloatTest_Test::~OpenDDLExportTest_writeFloatTest_Test
          (OpenDDLExportTest_writeFloatTest_Test *this)

{
  OpenDDLExportTest_writeFloatTest_Test *this_local;
  
  ~OpenDDLExportTest_writeFloatTest_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeFloatTest) {
    OpenDDLExportMock myExport;
    Value *v = ValueAllocator::allocPrimData(Value::ValueType::ddl_float);
    v->setFloat(1.1f);
    bool ok(true);
    std::string statement;
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("1.1", statement);
    ValueAllocator::releasePrimData(&v);
}